

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ConflictPoolPropagation::markPropagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  iterator __position;
  long lVar1;
  pointer puVar2;
  int local_14;
  
  lVar1 = (long)conflict;
  puVar2 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2[lVar1] < 2) {
    __position._M_current =
         (this->propagateConflictInds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->propagateConflictInds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_14 = conflict;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->propagateConflictInds_,__position,
                 &local_14);
      lVar1 = (long)local_14;
      puVar2 = (this->conflictFlag_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *__position._M_current = conflict;
      (this->propagateConflictInds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    puVar2[lVar1] = puVar2[lVar1] | 4;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::markPropagateConflict(
    HighsInt conflict) {
  if (conflictFlag_[conflict] < 2) {
    propagateConflictInds_.push_back(conflict);
    conflictFlag_[conflict] |= 4;
  }
}